

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

void cppcms_capi_session_delete(cppcms_capi_session *session)

{
  pointer pcVar1;
  
  if (session != (cppcms_capi_session *)0x0) {
    (session->adapter).super_session_interface_cookie_adapter._vptr_session_interface_cookie_adapter
         = (_func_int **)&PTR__cookie_adapter_0028d1d8;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&(session->adapter).keys._M_t);
    pcVar1 = (session->adapter).value._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(session->adapter).value.field_2) {
      operator_delete(pcVar1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
    ::~_Rb_tree(&(session->adapter).cookies._M_t);
    cppcms::session_interface_cookie_adapter::~session_interface_cookie_adapter
              (&(session->adapter).super_session_interface_cookie_adapter);
    pcVar1 = (session->returned_value)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(session->returned_value).field_2) {
      operator_delete(pcVar1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&(session->key_set)._M_t);
    booster::hold_ptr<cppcms::session_interface>::~hold_ptr(&session->p);
    pcVar1 = (session->e).s_msg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(session->e).s_msg.field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(session);
    return;
  }
  return;
}

Assistant:

void cppcms_capi_session_delete(cppcms_capi_session *session)
{
	if(session) delete session;
}